

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O0

size_t anon_unknown.dwarf_15986::pack_node(uchar *buf,NodeInfo *info)

{
  cali_attr_type cVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  void *__src;
  bool bVar5;
  uint64_t u;
  size_t pos;
  bool have_parent;
  NodeInfo *info_local;
  uchar *buf_local;
  
  bVar5 = info->parent_id != 0xffffffffffffffff;
  sVar2 = vlenc_u64(info->node_id * 2 + (long)(int)(uint)bVar5,buf);
  sVar3 = vlenc_u64(info->attr_id,buf + sVar2);
  u = sVar3 + sVar2;
  if (bVar5) {
    sVar2 = vlenc_u64(info->parent_id,buf + u);
    u = sVar2 + u;
  }
  cVar1 = cali::Variant::type(&info->value);
  sVar2 = vlenc_u64((ulong)cVar1,buf + u);
  sVar3 = cali::Variant::size(&info->value);
  sVar3 = vlenc_u64(sVar3,buf + sVar2 + u);
  lVar4 = sVar3 + sVar2 + u;
  __src = cali::Variant::data(&info->value);
  sVar2 = cali::Variant::size(&info->value);
  memcpy(buf + lVar4,__src,sVar2);
  sVar2 = cali::Variant::size(&info->value);
  return sVar2 + lVar4;
}

Assistant:

size_t pack_node(unsigned char* buf, const NodeBuffer::NodeInfo& info)
{
    bool   have_parent = (info.parent_id != CALI_INV_ID);
    size_t pos         = 0;

    // store id & flag in first uint: flag indicates whether parent ID is needed
    uint64_t u = 2 * info.node_id + (have_parent ? 1 : 0);

    pos += vlenc_u64(u, buf + pos);
    pos += vlenc_u64(info.attr_id, buf + pos);

    if (have_parent)
        pos += vlenc_u64(info.parent_id, buf + pos);

    // encode type and size and copy data directly for now
    pos += vlenc_u64(static_cast<uint64_t>(info.value.type()), buf + pos);
    pos += vlenc_u64(info.value.size(), buf + pos);
    memcpy(buf + pos, info.value.data(), info.value.size());

    pos += info.value.size();

    return pos;
}